

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

void tinyfd_beep(void)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  size_t sStack_410;
  char lDialogString [256];
  
  iVar1 = osascriptPresent();
  if (iVar1 == 0) {
    iVar1 = pactlPresent();
    if (iVar1 == 0) {
      if (speakertestPresent_lSpeakertestPresent < 0) {
        speakertestPresent_lSpeakertestPresent = detectPresence("speaker-test");
      }
      if (speakertestPresent_lSpeakertestPresent == 0) {
        if (beepexePresent_lBeepexePresent < 0) {
          beepexePresent_lBeepexePresent = detectPresence("beep.exe");
        }
        if (beepexePresent_lBeepexePresent == 0) {
          builtin_strncpy(lDialogString,"printf \'\a\' > /dev/tty",0x16);
        }
        else {
          lDialogString[0] = 'b';
          lDialogString[1] = 'e';
          lDialogString[2] = 'e';
          lDialogString[3] = 'p';
          lDialogString[4] = '.';
          lDialogString[5] = 'e';
          lDialogString[6] = 'x';
          lDialogString[7] = 'e';
          builtin_strncpy(lDialogString + 8," 440 300",9);
        }
        goto LAB_0010eb07;
      }
      pcVar2 = "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .3; kill -9 $pid";
      sStack_410 = 0x4a;
    }
    else {
      __sysv_signal(2,sigHandler);
      pcVar2 = 
      "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum";
      sStack_410 = 0x59;
    }
    memcpy(lDialogString,pcVar2,sStack_410);
  }
  else {
    if ((int)afplayPresent_lAfplayPresent < 0) {
      afplayPresent_lAfplayPresent = detectPresence("afplay");
      if (afplayPresent_lAfplayPresent != 0) {
        pFVar3 = popen("test -e /System/Library/Sounds/Ping.aiff || echo Ping","r");
        pcVar2 = fgets(lDialogString,0x400,pFVar3);
        if (pcVar2 == (char *)0x0) {
          afplayPresent_lAfplayPresent = 2;
        }
        pclose(pFVar3);
        if (tinyfd_verbose != 0) {
          printf("afplay %d\n",(ulong)afplayPresent_lAfplayPresent);
        }
      }
    }
    iVar1 = graphicMode();
    if ((iVar1 == 0) || ((int)afplayPresent_lAfplayPresent < 2)) {
      builtin_strncpy(lDialogString,"osascript -e \'tell application \"System Events\" to beep\'",
                      0x38);
    }
    else {
      builtin_strncpy(lDialogString,"afplay /System/Library/Sounds/Ping.aiff",0x28);
    }
  }
LAB_0010eb07:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lDialogString);
  }
  pFVar3 = popen(lDialogString,"r");
  if (pFVar3 != (FILE *)0x0) {
    pclose(pFVar3);
  }
  iVar1 = pactlPresent();
  if (iVar1 != 0) {
    __sysv_signal(2,(__sighandler_t)0x0);
  }
  return;
}

Assistant:

void tinyfd_beep()
{
        char lDialogString [256] ;
        FILE * lIn ;

        if ( osascriptPresent() )
        {
                if ( afplayPresent() >= 2 )
                {
                        strcpy( lDialogString , "afplay /System/Library/Sounds/Ping.aiff") ;
                }
                else
                {
                        strcpy( lDialogString , "osascript -e 'tell application \"System Events\" to beep'") ;
                }
        }
        else if ( pactlPresent() ) 
        {
                signal(SIGINT, sigHandler);
                /*strcpy( lDialogString , "pactl load-module module-sine frequency=440;sleep .3;pactl unload-module module-sine" ) ;*/
                strcpy( lDialogString , "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum" ) ;
        }
        else if ( speakertestPresent() ) 
        {
                /*strcpy( lDialogString , "timeout -k .3 .3 speaker-test --frequency 440 --test sine > /dev/tty" ) ;*/
                strcpy( lDialogString , "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .3; kill -9 $pid" ) ;
        }
        else if ( beepexePresent() ) 
        {
                strcpy( lDialogString , "beep.exe 440 300" ) ;
        }
        else
        {
                strcpy( lDialogString , "printf '\a' > /dev/tty" ) ;
        }

        if (tinyfd_verbose) printf( "lDialogString: %s\n" , lDialogString ) ;

        if ( ( lIn = popen( lDialogString , "r" ) ) )
        {
                pclose( lIn ) ;
        }

        if ( pactlPresent() )
        {
                signal(SIGINT, SIG_DFL);
        }
}